

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_Server.cpp
# Opt level: O3

string_view __thiscall RenX::Server::getMapName(Server *this,string_view name)

{
  pointer pMVar1;
  size_t sVar2;
  size_type sVar3;
  pointer pcVar4;
  pointer pMVar5;
  string_view sVar6;
  basic_string_view<char,_std::char_traits<char>_> in_string;
  
  pMVar5 = (this->maps).super__Vector_base<RenX::Map,_std::allocator<RenX::Map>_>._M_impl.
           super__Vector_impl_data._M_start;
  pMVar1 = (this->maps).super__Vector_base<RenX::Map,_std::allocator<RenX::Map>_>._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    if (pMVar5 == pMVar1) {
      pcVar4 = (pointer)0x0;
      sVar3 = 0;
LAB_00131c74:
      sVar6._M_str = pcVar4;
      sVar6._M_len = sVar3;
      return sVar6;
    }
    in_string._M_str = (pMVar5->name)._M_dataplus._M_p;
    in_string._M_len = (pMVar5->name)._M_string_length;
    sVar2 = jessilib::find<char,char,false>(in_string,name);
    if (sVar2 != 0xffffffffffffffff) {
      pcVar4 = (pMVar5->name)._M_dataplus._M_p;
      sVar3 = (pMVar5->name)._M_string_length;
      goto LAB_00131c74;
    }
    pMVar5 = pMVar5 + 1;
  } while( true );
}

Assistant:

bool RenX::Server::isCratesEnabled() const {
	return m_spawnCrates;
}